

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  char *in_RDI;
  GLFWglproc proc;
  _GLFWwindow *window;
  char *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  GLFWproc local_8;
  
  pvVar1 = _glfwPlatformGetTls((_GLFWtls *)0xa585ec);
  if ((*(long *)((long)pvVar1 + 0x2a0) == 0) ||
     (local_8 = _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8),
     local_8 == (GLFWproc)0x0)) {
    local_8 = (*_glfw.egl.GetProcAddress)(in_RDI);
  }
  return local_8;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);
    assert(window != NULL);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc)
            _glfwPlatformGetModuleSymbol(window->context.egl.client, procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}